

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

int __thiscall
ezc3d::c3d::readInt(c3d *this,PROCESSOR_TYPE processorType,fstream *file,uint nByteToRead,
                   int nByteFromPrevious,seekdir *pos)

{
  int iVar1;
  reference pvVar2;
  uint in_ECX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  fstream *in_R9;
  size_t i;
  int out;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  value_type vVar3;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  ulong __n;
  uint in_stack_ffffffffffffffd4;
  
  if (*(uint *)(in_RDI + 0x84) < in_ECX) {
    resizeCharHolder(this,processorType);
  }
  readFile((c3d *)CONCAT44(in_ECX,in_R8D),in_R9,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
           (int)((ulong)in_RDI >> 0x20),
           (seekdir *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (in_ESI == 0x56) {
    for (__n = 0; __n < in_ECX; __n = __n + 1) {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x50),(in_ECX - 1) - __n)
      ;
      vVar3 = *pvVar2;
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x68),__n);
      *pvVar2 = vVar3;
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x68),(ulong)in_ECX);
    *pvVar2 = '\0';
    iVar1 = hex2int((c3d *)CONCAT44(in_ECX,in_R8D),(vector<char,_std::allocator<char>_> *)in_R9,
                    in_stack_ffffffffffffffd4);
  }
  else {
    iVar1 = hex2int((c3d *)CONCAT44(in_ECX,in_R8D),(vector<char,_std::allocator<char>_> *)in_R9,
                    in_stack_ffffffffffffffd4);
  }
  return iVar1;
}

Assistant:

int ezc3d::c3d::readInt(PROCESSOR_TYPE processorType, std::fstream &file,
                        unsigned int nByteToRead, int nByteFromPrevious,
                        const std::ios_base::seekdir &pos) {
  if (nByteToRead > m_nByteToReadMax_int)
    resizeCharHolder(nByteToRead);

  readFile(file, nByteToRead, c_int, nByteFromPrevious, pos);

  int out;
  if (processorType == PROCESSOR_TYPE::MIPS) {
    // This is more or less good. Sometimes, it should not reverse...
    for (size_t i = 0; i < nByteToRead; ++i) {
      c_int_tp[i] = c_int[nByteToRead - 1 - i];
    }
    c_int_tp[nByteToRead] = '\0';
    out = hex2int(c_int_tp, nByteToRead);
  } else {
    // make sure it is an int and not an unsigned int
    out = hex2int(c_int, nByteToRead);
  }

  return out;
}